

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

wchar_t archive_read_format_cab_read_header(archive_read *a,archive_entry *entry)

{
  archive_wstring *as;
  byte bVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  ushort uVar5;
  ushort uVar6;
  undefined8 *puVar7;
  void *pvVar8;
  wchar_t wVar9;
  int iVar10;
  uint uVar11;
  uchar *p;
  char *pcVar12;
  void *pvVar13;
  uint *puVar14;
  archive_string_conv *paVar15;
  int *piVar16;
  wchar_t *pwVar17;
  size_t n;
  time_t tVar18;
  ulong uVar19;
  bool bVar20;
  size_t i_1;
  uint uVar21;
  size_t i;
  char *pcVar22;
  undefined8 *puVar23;
  wchar_t wVar24;
  ulong uVar25;
  mode_t m;
  long lVar26;
  uint uVar27;
  int iVar28;
  char *p_00;
  ulong uVar29;
  uchar *p_1;
  long lVar30;
  ssize_t window;
  size_t sVar31;
  long lVar32;
  uint *puVar33;
  ssize_t bytes;
  uint local_5c;
  long local_38;
  
  puVar7 = (undefined8 *)a->format->data;
  wVar24 = L'\0';
  if (*(char *)(puVar7 + 0x12) == '\0') {
    (a->archive).archive_format = 0xc0000;
    if ((a->archive).archive_format_name == (char *)0x0) {
      (a->archive).archive_format_name = "CAB";
    }
    pcVar12 = (char *)__archive_read_ahead(a,0x2a,(ssize_t *)0x0);
    if (pcVar12 == (char *)0x0) {
LAB_004f5166:
      pcVar12 = "Truncated CAB header";
LAB_004f516d:
      archive_set_error(&a->archive,0x54,pcVar12);
      wVar24 = L'\xffffffe2';
    }
    else {
      pvVar8 = a->format->data;
      if (((*(char *)((long)pvVar8 + 0x90) == '\0') && (*pcVar12 == 'M')) && (pcVar12[1] == 'Z')) {
        sVar31 = 0x1000;
        do {
          pcVar12 = (char *)__archive_read_ahead(a,sVar31,&local_38);
          if (pcVar12 == (char *)0x0) {
            sVar31 = (long)sVar31 >> 1;
            iVar10 = 3;
            if (sVar31 < 0x80) {
              archive_set_error(&a->archive,0x54,"Couldn\'t find out CAB header");
              wVar24 = L'\xffffffe2';
              iVar10 = 1;
            }
          }
          else {
            pcVar22 = pcVar12 + local_38;
            for (p_00 = pcVar12; p_00 + 8 < pcVar22; p_00 = p_00 + (uint)wVar9) {
              wVar9 = find_cab_magic(p_00);
              if (wVar9 == L'\0') {
                __archive_read_consume(a,(long)p_00 - (long)pcVar12);
                wVar24 = L'\0';
                iVar10 = 1;
                goto LAB_004f4ef6;
              }
            }
            __archive_read_consume(a,(long)p_00 - (long)pcVar12);
            iVar10 = 0;
          }
LAB_004f4ef6:
        } while ((iVar10 == 0) || (iVar10 == 3));
        if (L'\xffffffeb' < wVar24) {
          pcVar12 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
          if (pcVar12 == (char *)0x0) goto LAB_004f5166;
          goto LAB_004f4f32;
        }
      }
      else {
LAB_004f4f32:
        *(undefined8 *)((long)pvVar8 + 0x40) = 0;
        if (((*pcVar12 != 'M') || (pcVar12[1] != 'S')) ||
           ((pcVar12[2] != 'C' || (pcVar12[3] != 'F')))) {
          pcVar12 = "Couldn\'t find out CAB header";
          goto LAB_004f516d;
        }
        *(undefined4 *)((long)pvVar8 + 0x48) = *(undefined4 *)(pcVar12 + 8);
        *(undefined4 *)((long)pvVar8 + 0x4c) = *(undefined4 *)(pcVar12 + 0x10);
        *(char *)((long)pvVar8 + 0x5b) = pcVar12[0x18];
        *(char *)((long)pvVar8 + 0x5a) = pcVar12[0x19];
        sVar4 = *(short *)(pcVar12 + 0x1a);
        *(short *)((long)pvVar8 + 0x50) = sVar4;
        if ((sVar4 == 0) ||
           (sVar4 = *(short *)(pcVar12 + 0x1c), *(short *)((long)pvVar8 + 0x52) = sVar4, sVar4 == 0)
           ) {
LAB_004f58f8:
          pcVar12 = "Invalid CAB header";
LAB_004f5904:
          iVar10 = 0x54;
LAB_004f5909:
          archive_set_error(&a->archive,iVar10,pcVar12);
        }
        else {
          bVar1 = pcVar12[0x1e];
          *(undefined2 *)((long)pvVar8 + 0x54) = *(undefined2 *)(pcVar12 + 0x1e);
          *(undefined2 *)((long)pvVar8 + 0x56) = *(undefined2 *)(pcVar12 + 0x20);
          *(undefined2 *)((long)pvVar8 + 0x58) = *(undefined2 *)(pcVar12 + 0x22);
          if ((bVar1 & 4) == 0) {
            *(undefined1 *)((long)pvVar8 + 0x5c) = 0;
            lVar32 = 0x24;
          }
          else {
            uVar5 = *(ushort *)(pcVar12 + 0x24);
            if (60000 < uVar5) goto LAB_004f58f8;
            *(char *)((long)pvVar8 + 0x5c) = pcVar12[0x26];
            *(char *)((long)pvVar8 + 0x5d) = pcVar12[0x27];
            lVar32 = (ulong)uVar5 + 0x28;
          }
          if ((bVar1 & 1) != 0) {
            pvVar13 = __archive_read_ahead(a,lVar32 + 0x100,(ssize_t *)0x0);
            if (pvVar13 != (void *)0x0) {
              lVar30 = 0;
              do {
                if (*(char *)((long)pvVar13 + lVar30 + lVar32) == '\0') goto LAB_004f54d7;
                lVar30 = lVar30 + 1;
              } while (lVar30 != 0x100);
              lVar30 = -1;
LAB_004f54d7:
              if (0 < lVar30) {
                pvVar13 = __archive_read_ahead(a,lVar32 + lVar30 + 0x101,(ssize_t *)0x0);
                if (pvVar13 == (void *)0x0) {
LAB_004f55e5:
                  pcVar12 = "Truncated CAB header";
                  goto LAB_004f5904;
                }
                lVar32 = lVar32 + lVar30 + 1;
                lVar30 = 0;
                do {
                  if (*(char *)((long)pvVar13 + lVar30 + lVar32) == '\0') goto LAB_004f5525;
                  lVar30 = lVar30 + 1;
                } while (lVar30 != 0x100);
                lVar30 = -1;
LAB_004f5525:
                if (0 < lVar30) {
                  lVar32 = lVar32 + lVar30 + 1;
                  goto LAB_004f5036;
                }
              }
              goto LAB_004f58f8;
            }
LAB_004f55d6:
            pcVar12 = "Truncated CAB header";
            goto LAB_004f5904;
          }
LAB_004f5036:
          if ((*(byte *)((long)pvVar8 + 0x54) & 2) != 0) {
            pvVar13 = __archive_read_ahead(a,lVar32 + 0x100,(ssize_t *)0x0);
            if (pvVar13 == (void *)0x0) goto LAB_004f55d6;
            lVar30 = 0;
            do {
              if (*(char *)((long)pvVar13 + lVar30 + lVar32) == '\0') goto LAB_004f5572;
              lVar30 = lVar30 + 1;
            } while (lVar30 != 0x100);
            lVar30 = -1;
LAB_004f5572:
            if (0 < lVar30) {
              pvVar13 = __archive_read_ahead(a,lVar32 + lVar30 + 0x101,(ssize_t *)0x0);
              if (pvVar13 == (void *)0x0) goto LAB_004f55e5;
              lVar32 = lVar32 + lVar30 + 1;
              lVar30 = 0;
              do {
                if (*(char *)((long)pvVar13 + lVar30 + lVar32) == '\0') goto LAB_004f55bc;
                lVar30 = lVar30 + 1;
              } while (lVar30 != 0x100);
              lVar30 = -1;
LAB_004f55bc:
              if (0 < lVar30) {
                lVar32 = lVar32 + lVar30 + 1;
                goto LAB_004f5047;
              }
            }
            goto LAB_004f58f8;
          }
LAB_004f5047:
          __archive_read_consume(a,lVar32);
          *(long *)((long)pvVar8 + 0x40) = *(long *)((long)pvVar8 + 0x40) + lVar32;
          uVar5 = *(ushort *)((long)pvVar8 + 0x50);
          pvVar13 = calloc((ulong)uVar5,0x60);
          *(void **)((long)pvVar8 + 0x60) = pvVar13;
          if (pvVar13 == (void *)0x0) {
LAB_004f5896:
            pcVar12 = "Can\'t allocate memory for CAB data";
            iVar10 = 0xc;
            goto LAB_004f5909;
          }
          lVar32 = 8;
          if ((*(byte *)((long)pvVar8 + 0x54) & 4) != 0) {
            lVar32 = (ulong)*(byte *)((long)pvVar8 + 0x5c) + 8;
          }
          uVar29 = 0;
          puVar14 = (uint *)__archive_read_ahead(a,lVar32 * (ulong)uVar5,(ssize_t *)0x0);
          if (puVar14 == (uint *)0x0) goto LAB_004f5166;
          uVar5 = *(ushort *)((long)pvVar8 + 0x50);
          if (uVar5 == 0) {
            lVar32 = 0;
          }
          else {
            lVar30 = *(long *)((long)pvVar8 + 0x60);
            uVar6 = *(ushort *)((long)pvVar8 + 0x54);
            lVar26 = 0;
            lVar32 = 0;
            uVar27 = 0;
            do {
              uVar11 = *puVar14;
              *(uint *)(lVar30 + lVar26) = uVar11;
              *(short *)(lVar30 + 4 + lVar26) = (short)puVar14[1];
              uVar21 = *(byte *)((long)puVar14 + 6) & 0xf;
              *(short *)(lVar30 + 6 + lVar26) = (short)uVar21;
              *(ushort *)(lVar30 + 8 + lVar26) = (ushort)*(byte *)((long)puVar14 + 7);
              pcVar12 = "UNKNOWN";
              if ((byte)uVar21 < 4) {
                pcVar12 = compression_name_rel + *(int *)(compression_name_rel + (ulong)uVar21 * 4);
              }
              puVar14 = puVar14 + 2;
              lVar32 = lVar32 + 8;
              *(char **)(lVar30 + 0x10 + lVar26) = pcVar12;
              if ((uVar6 & 4) != 0) {
                puVar14 = (uint *)((long)puVar14 + (ulong)*(byte *)((long)pvVar8 + 0x5c));
                lVar32 = lVar32 + (ulong)*(byte *)((long)pvVar8 + 0x5c);
              }
              uVar21 = uVar27;
              if (uVar27 < uVar11) {
                *(undefined1 *)(lVar30 + 0x5c + lVar26) = 0;
                uVar21 = uVar11;
              }
              uVar29 = (ulong)uVar21;
              if (uVar11 <= uVar27) goto LAB_004f58f8;
              lVar26 = lVar26 + 0x60;
              uVar27 = uVar21;
            } while ((ulong)uVar5 * 0x60 != lVar26);
          }
          __archive_read_consume(a,lVar32);
          lVar32 = lVar32 + *(long *)((long)pvVar8 + 0x40);
          *(long *)((long)pvVar8 + 0x40) = lVar32;
          lVar30 = (ulong)*(uint *)((long)pvVar8 + 0x4c) - lVar32;
          if (-1 < lVar30) {
            if (lVar30 != 0) {
              __archive_read_consume(a,lVar30);
              *(long *)((long)pvVar8 + 0x40) = *(long *)((long)pvVar8 + 0x40) + lVar30;
            }
            uVar5 = *(ushort *)((long)pvVar8 + 0x52);
            pvVar13 = calloc((ulong)uVar5,0x30);
            *(void **)((long)pvVar8 + 0x68) = pvVar13;
            if (pvVar13 != (void *)0x0) {
              if (uVar5 != 0) {
                local_5c = 0xffffffff;
                uVar25 = 0;
                do {
                  puVar33 = (uint *)(uVar25 * 0x30 + *(long *)((long)pvVar8 + 0x68));
                  puVar14 = (uint *)__archive_read_ahead(a,0x10,(ssize_t *)0x0);
                  if (puVar14 == (uint *)0x0) {
LAB_004f57d3:
                    archive_set_error(&a->archive,0x54,"Truncated CAB header");
                    iVar10 = 1;
                  }
                  else {
                    *puVar33 = *puVar14;
                    puVar33[1] = puVar14[1];
                    *(short *)(puVar33 + 4) = (short)puVar14[2];
                    tVar18 = cab_dos_time((uchar *)((long)puVar14 + 10));
                    *(time_t *)(puVar33 + 2) = tVar18;
                    *(undefined1 *)((long)puVar33 + 0x12) = *(undefined1 *)((long)puVar14 + 0xe);
                    __archive_read_consume(a,0x10);
                    *(long *)((long)pvVar8 + 0x40) = *(long *)((long)pvVar8 + 0x40) + 0x10;
                    sVar31 = 0x100;
                    do {
                      pvVar13 = __archive_read_ahead(a,sVar31,&local_38);
                      if (pvVar13 != (void *)0x0) goto LAB_004f5705;
                      sVar31 = sVar31 - 1;
                    } while (sVar31 != 0);
                    pvVar13 = (void *)0x0;
LAB_004f5705:
                    if (pvVar13 == (void *)0x0) goto LAB_004f57d3;
                    sVar31 = 0;
                    do {
                      if (*(char *)((long)pvVar13 + sVar31) == '\0') goto LAB_004f572f;
                      sVar31 = sVar31 + 1;
                    } while (sVar31 <= local_38 - 1U);
                    sVar31 = 0xffffffffffffffff;
LAB_004f572f:
                    iVar10 = 2;
                    iVar28 = 2;
                    if (0 < (long)sVar31) {
                      puVar33[6] = 0;
                      puVar33[7] = 0;
                      puVar33[8] = 0;
                      puVar33[9] = 0;
                      puVar33[10] = 0;
                      puVar33[0xb] = 0;
                      archive_strncat((archive_string *)(puVar33 + 6),pvVar13,sVar31);
                      __archive_read_consume(a,sVar31 + 1);
                      *(long *)((long)pvVar8 + 0x40) = *(long *)((long)pvVar8 + 0x40) + sVar31 + 1;
                      uVar19 = (ulong)*puVar33;
                      if (uVar19 < 0x7fff8001) {
                        uVar27 = puVar33[1];
                        if (uVar27 + uVar19 < 0x7fff8001) {
                          uVar5 = (ushort)puVar33[4];
                          uVar11 = (uint)uVar5;
                          iVar10 = iVar28;
                          if (uVar5 == 0xfffd) {
                            if (uVar25 == 0) {
LAB_004f5834:
                              uVar11 = 0;
                              local_5c = 0;
                              uVar29 = (ulong)uVar27;
                              goto LAB_004f584e;
                            }
                          }
                          else if (uVar5 == 0xffff) {
                            if ((uVar25 == 0) && (*(short *)((long)pvVar8 + 0x52) == 1))
                            goto LAB_004f5834;
                          }
                          else if (uVar5 == 0xfffe) {
                            if (uVar25 == *(ushort *)((long)pvVar8 + 0x52) - 1) {
                              uVar11 = *(ushort *)((long)pvVar8 + 0x50) - 1;
LAB_004f584e:
                              if ((int)local_5c <= (int)uVar11) {
                                if (uVar11 != local_5c) {
                                  uVar29 = 0;
                                }
                                local_5c = uVar11;
                                if (((uint)uVar29 == uVar27) &&
                                   ((uVar29 = (ulong)((uint)uVar29 + *puVar33), uVar19 == 0 ||
                                    (*(short *)(*(long *)((long)pvVar8 + 0x60) + 4 +
                                               (long)(int)uVar11 * 0x60) != 0)))) {
                                  iVar10 = 0;
                                }
                              }
                            }
                          }
                          else if (uVar5 < *(ushort *)((long)pvVar8 + 0x50)) goto LAB_004f584e;
                        }
                      }
                    }
                  }
                  if (iVar10 != 0) {
                    if (iVar10 != 2) goto LAB_004f5910;
                    goto LAB_004f58f8;
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 < *(ushort *)((long)pvVar8 + 0x52));
              }
              if ((*(short *)((long)pvVar8 + 0x58) == 0) &&
                 ((*(byte *)((long)pvVar8 + 0x54) & 3) == 0)) {
                wVar24 = L'\0';
              }
              else {
                archive_set_error(&a->archive,0x54,"Multivolume cabinet file is unsupported");
                wVar24 = L'\xffffffec';
              }
              goto LAB_004f5181;
            }
            goto LAB_004f5896;
          }
          archive_set_error(&a->archive,-1,"Invalid offset of CFFILE %jd < %jd",
                            (ulong)*(uint *)((long)pvVar8 + 0x4c),lVar32);
        }
LAB_004f5910:
        wVar24 = L'\xffffffe2';
      }
    }
LAB_004f5181:
    if (wVar24 < L'\xffffffec') {
      return wVar24;
    }
    *(undefined1 *)(puVar7 + 0x12) = 1;
  }
  iVar10 = *(int *)(puVar7 + 0xe);
  if ((int)(uint)*(ushort *)((long)puVar7 + 0x52) <= iVar10) {
    *(undefined1 *)((long)puVar7 + 0x91) = 1;
    return L'\x01';
  }
  lVar32 = puVar7[5];
  *(int *)(puVar7 + 0xe) = iVar10 + 1;
  puVar14 = (uint *)(puVar7[0xd] + (long)iVar10 * 0x30);
  *(undefined2 *)((long)puVar7 + 0x92) = 0;
  puVar7[2] = 0;
  puVar7[3] = 0;
  puVar7[4] = 0;
  puVar7[6] = puVar14;
  uVar5 = *(ushort *)(puVar7[0xd] + 0x10 + (long)iVar10 * 0x30);
  if (uVar5 == 0xffff) {
LAB_004f51f5:
    lVar30 = puVar7[0xc];
  }
  else if (uVar5 == 0xfffe) {
    lVar30 = puVar7[0xc] + (ulong)((uint)*(ushort *)(puVar7 + 10) * 0x60) + -0x60;
  }
  else {
    if (uVar5 == 0xfffd) goto LAB_004f51f5;
    lVar30 = (ulong)((uint)uVar5 * 0x60) + puVar7[0xc];
  }
  puVar7[5] = lVar30;
  if (lVar32 != lVar30) {
    puVar7[7] = 0;
  }
  if (*(char *)((long)puVar14 + 0x12) < '\0') {
    puVar23 = puVar7 + 0x19;
    if (puVar7[0x19] != 0) {
LAB_004f52c2:
      paVar15 = (archive_string_conv *)*puVar23;
      goto LAB_004f52c5;
    }
    paVar15 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    *puVar23 = paVar15;
    if (paVar15 != (archive_string_conv *)0x0) goto LAB_004f52c2;
LAB_004f535c:
    wVar24 = L'\xffffffe2';
  }
  else {
    paVar15 = (archive_string_conv *)puVar7[0x17];
    if (paVar15 == (archive_string_conv *)0x0) {
      if (*(int *)(puVar7 + 0x16) == 0) {
        paVar15 = archive_string_default_conversion_for_read(&a->archive);
        puVar7[0x18] = paVar15;
        *(undefined4 *)(puVar7 + 0x16) = 1;
      }
      puVar23 = puVar7 + 0x18;
      goto LAB_004f52c2;
    }
LAB_004f52c5:
    uVar29 = *(ulong *)(puVar14 + 8);
    bVar20 = false;
    if (uVar29 == 0) {
      uVar25 = 0;
    }
    else {
      cVar2 = *(char *)((long)puVar14 + 0x12);
      uVar25 = 0;
      do {
        cVar3 = *(char *)(*(long *)(puVar14 + 6) + uVar25);
        if (cVar3 == '\\') {
          if (bVar20) break;
          *(undefined1 *)(*(long *)(puVar14 + 6) + uVar25) = 0x2f;
          bVar20 = false;
        }
        else {
          bVar20 = cVar3 < '\0' && -1 < cVar2;
        }
        uVar25 = uVar25 + 1;
        uVar29 = *(ulong *)(puVar14 + 8);
      } while (uVar25 < uVar29);
    }
    wVar9 = _archive_entry_copy_pathname_l
                      (entry,*(char **)(puVar14 + 6),*(size_t *)(puVar14 + 8),paVar15);
    if (wVar9 != L'\0') {
      piVar16 = __errno_location();
      if (*piVar16 == 0xc) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
        goto LAB_004f535c;
      }
      pcVar12 = archive_string_conversion_charset_name(paVar15);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                        pcVar12);
      wVar24 = L'\xffffffec';
    }
    if ((uVar25 != uVar29) && (pwVar17 = archive_entry_pathname_w(entry), pwVar17 != (wchar_t *)0x0)
       ) {
      as = (archive_wstring *)(puVar7 + 0xf);
      puVar7[0x10] = 0;
      n = wcslen(pwVar17);
      archive_wstrncat(as,pwVar17,n);
      lVar32 = puVar7[0x10];
      if (lVar32 != 0) {
        pwVar17 = as->s;
        lVar30 = 0;
        do {
          if (pwVar17[lVar30] == L'\\') {
            pwVar17[lVar30] = L'/';
          }
          lVar30 = lVar30 + 1;
        } while (lVar32 != lVar30);
      }
      archive_entry_copy_pathname_w(entry,as->s);
    }
    archive_entry_set_size(entry,(ulong)*puVar14);
    m = 0x816d;
    if ((*(byte *)((long)puVar14 + 0x12) & 1) == 0) {
      m = 0x81b6;
    }
    archive_entry_set_mode(entry,m);
    archive_entry_set_mtime(entry,*(time_t *)(puVar14 + 2),0);
    uVar27 = *puVar14;
    puVar7[1] = (ulong)uVar27;
    *puVar7 = 0;
    if ((ulong)uVar27 == 0) {
      *(undefined2 *)((long)puVar7 + 0x92) = 0x101;
    }
    sprintf((char *)(puVar7 + 0x1a),"CAB %d.%d (%s)",(ulong)*(byte *)((long)puVar7 + 0x5a),
            (ulong)*(byte *)((long)puVar7 + 0x5b),*(undefined8 *)(puVar7[5] + 0x10));
    (a->archive).archive_format_name = (char *)(puVar7 + 0x1a);
  }
  return wVar24;
}

Assistant:

static int
cab_read_header(struct archive_read *a)
{
	const unsigned char *p;
	struct cab *cab;
	struct cfheader *hd;
	size_t bytes, used;
	ssize_t len;
	int64_t skip;
	int err, i;
	int cur_folder, prev_folder;
	uint32_t offset32;
	
	a->archive.archive_format = ARCHIVE_FORMAT_CAB;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "CAB";

	if ((p = __archive_read_ahead(a, 42, NULL)) == NULL)
		return (truncated_error(a));

	cab = (struct cab *)(a->format->data);
	if (cab->found_header == 0 &&
	    p[0] == 'M' && p[1] == 'Z') {
		/* This is an executable?  Must be self-extracting... 	*/
		err = cab_skip_sfx(a);
		if (err < ARCHIVE_WARN)
			return (err);

		if ((p = __archive_read_ahead(a, sizeof(*p), NULL)) == NULL)
			return (truncated_error(a));
	}

	cab->cab_offset = 0;
	/*
	 * Read CFHEADER.
	 */
	hd = &cab->cfheader;
	if (p[CFHEADER_signature+0] != 'M' || p[CFHEADER_signature+1] != 'S' ||
	    p[CFHEADER_signature+2] != 'C' || p[CFHEADER_signature+3] != 'F') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Couldn't find out CAB header");
		return (ARCHIVE_FATAL);
	}
	hd->total_bytes = archive_le32dec(p + CFHEADER_cbCabinet);
	hd->files_offset = archive_le32dec(p + CFHEADER_coffFiles);
	hd->minor = p[CFHEADER_versionMinor];
	hd->major = p[CFHEADER_versionMajor];
	hd->folder_count = archive_le16dec(p + CFHEADER_cFolders);
	if (hd->folder_count == 0)
		goto invalid;
	hd->file_count = archive_le16dec(p + CFHEADER_cFiles);
	if (hd->file_count == 0)
		goto invalid;
	hd->flags = archive_le16dec(p + CFHEADER_flags);
	hd->setid = archive_le16dec(p + CFHEADER_setID);
	hd->cabinet = archive_le16dec(p + CFHEADER_iCabinet);
	used = CFHEADER_iCabinet + 2;
	if (hd->flags & RESERVE_PRESENT) {
		uint16_t cfheader;
		cfheader = archive_le16dec(p + CFHEADER_cbCFHeader);
		if (cfheader > 60000U)
			goto invalid;
		hd->cffolder = p[CFHEADER_cbCFFolder];
		hd->cfdata = p[CFHEADER_cbCFData];
		used += 4;/* cbCFHeader, cbCFFolder and cbCFData */
		used += cfheader;/* abReserve */
	} else
		hd->cffolder = 0;/* Avoid compiling warning. */
	if (hd->flags & PREV_CABINET) {
		/* How many bytes are used for szCabinetPrev. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
		/* How many bytes are used for szDiskPrev. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
	}
	if (hd->flags & NEXT_CABINET) {
		/* How many bytes are used for szCabinetNext. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
		/* How many bytes are used for szDiskNext. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
	}
	__archive_read_consume(a, used);
	cab->cab_offset += used;
	used = 0;

	/*
	 * Read CFFOLDER.
	 */
	hd->folder_array = (struct cffolder *)calloc(
	    hd->folder_count, sizeof(struct cffolder));
	if (hd->folder_array == NULL)
		goto nomem;
	
	bytes = 8;
	if (hd->flags & RESERVE_PRESENT)
		bytes += hd->cffolder;
	bytes *= hd->folder_count;
	if ((p = __archive_read_ahead(a, bytes, NULL)) == NULL)
		return (truncated_error(a));
	offset32 = 0;
	for (i = 0; i < hd->folder_count; i++) {
		struct cffolder *folder = &(hd->folder_array[i]);
		folder->cfdata_offset_in_cab =
		    archive_le32dec(p + CFFOLDER_coffCabStart);
		folder->cfdata_count = archive_le16dec(p+CFFOLDER_cCFData);
		folder->comptype =
		    archive_le16dec(p+CFFOLDER_typeCompress) & 0x0F;
		folder->compdata =
		    archive_le16dec(p+CFFOLDER_typeCompress) >> 8;
		/* Get a compression name. */
		if (folder->comptype <
		    sizeof(compression_name) / sizeof(compression_name[0]))
			folder->compname = compression_name[folder->comptype];
		else
			folder->compname = "UNKNOWN";
		p += 8;
		used += 8;
		if (hd->flags & RESERVE_PRESENT) {
			p += hd->cffolder;/* abReserve */
			used += hd->cffolder;
		}
		/*
		 * Sanity check if each data is acceptable.
		 */
		if (offset32 >= folder->cfdata_offset_in_cab)
			goto invalid;
		offset32 = folder->cfdata_offset_in_cab;

		/* Set a request to initialize zlib for the CFDATA of
		 * this folder. */
		folder->decompress_init = 0;
	}
	__archive_read_consume(a, used);
	cab->cab_offset += used;

	/*
	 * Read CFFILE.
	 */
	/* Seek read pointer to the offset of CFFILE if needed. */
	skip = (int64_t)hd->files_offset - cab->cab_offset;
	if (skip <  0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid offset of CFFILE %jd < %jd",
		    (intmax_t)hd->files_offset, (intmax_t)cab->cab_offset);
		return (ARCHIVE_FATAL);
	}
	if (skip) {
		__archive_read_consume(a, skip);
		cab->cab_offset += skip;
	}
	/* Allocate memory for CFDATA */
	hd->file_array = (struct cffile *)calloc(
	    hd->file_count, sizeof(struct cffile));
	if (hd->file_array == NULL)
		goto nomem;

	prev_folder = -1;
	for (i = 0; i < hd->file_count; i++) {
		struct cffile *file = &(hd->file_array[i]);
		ssize_t avail;

		if ((p = __archive_read_ahead(a, 16, NULL)) == NULL)
			return (truncated_error(a));
		file->uncompressed_size = archive_le32dec(p + CFFILE_cbFile);
		file->offset = archive_le32dec(p + CFFILE_uoffFolderStart);
		file->folder = archive_le16dec(p + CFFILE_iFolder);
		file->mtime = cab_dos_time(p + CFFILE_date_time);
		file->attr = (uint8_t)archive_le16dec(p + CFFILE_attribs);
		__archive_read_consume(a, 16);

		cab->cab_offset += 16;
		if ((p = cab_read_ahead_remaining(a, 256, &avail)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p, avail-1)) <= 0)
			goto invalid;

		/* Copy a pathname.  */
		archive_string_init(&(file->pathname));
		archive_strncpy(&(file->pathname), p, len);
		__archive_read_consume(a, len + 1);
		cab->cab_offset += len + 1;

		/*
		 * Sanity check if each data is acceptable.
		 */
		if (file->uncompressed_size > 0x7FFF8000)
			goto invalid;/* Too large */
		if ((int64_t)file->offset + (int64_t)file->uncompressed_size
		    > ARCHIVE_LITERAL_LL(0x7FFF8000))
			goto invalid;/* Too large */
		switch (file->folder) {
		case iFoldCONTINUED_TO_NEXT:
			/* This must be last file in a folder. */
			if (i != hd->file_count -1)
				goto invalid;
			cur_folder = hd->folder_count -1;
			break;
		case iFoldCONTINUED_PREV_AND_NEXT:
			/* This must be only one file in a folder. */
			if (hd->file_count != 1)
				goto invalid;
			/* FALL THROUGH */
		case iFoldCONTINUED_FROM_PREV:
			/* This must be first file in a folder. */
			if (i != 0)
				goto invalid;
			prev_folder = cur_folder = 0;
			offset32 = file->offset;
			break;
		default:
			if (file->folder >= hd->folder_count)
				goto invalid;
			cur_folder = file->folder;
			break;
		}
		/* Dot not back track. */
		if (cur_folder < prev_folder)
			goto invalid;
		if (cur_folder != prev_folder)
			offset32 = 0;
		prev_folder = cur_folder;

		/* Make sure there are not any blanks from last file
		 * contents. */
		if (offset32 != file->offset)
			goto invalid;
		offset32 += file->uncompressed_size;

		/* CFDATA is available for file contents. */
		if (file->uncompressed_size > 0 &&
		    hd->folder_array[cur_folder].cfdata_count == 0)
			goto invalid;
	}

	if (hd->cabinet != 0 || hd->flags & (PREV_CABINET | NEXT_CABINET)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Multivolume cabinet file is unsupported");
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid CAB header");
	return (ARCHIVE_FATAL);
nomem:
	archive_set_error(&a->archive, ENOMEM,
	    "Can't allocate memory for CAB data");
	return (ARCHIVE_FATAL);
}